

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix-improved.c
# Opt level: O0

void cradix_rantala(LPPSTR a,UINT n)

{
  int *piVar1;
  int iVar2;
  LPPSTR a_00;
  LPPSTR kb_00;
  LPPSTR ta_00;
  LPBYTE __ptr;
  ulong n_00;
  ulong d_00;
  ulong uVar3;
  long lVar4;
  LPPSTR *pppuVar5;
  Stack *pSVar6;
  LPPSTR t;
  LPPSTR tc;
  LPPSTR ta;
  LPPSTR ak;
  LPPSTR GrpKP [256];
  LPSTR GrpKB [256];
  uchar *local_8a0;
  LPSTR tt;
  LPSTR ss;
  LPSTR kb;
  LPSTR tl;
  LPSTR ax;
  LPSTR tk;
  LPSTR tj;
  UINT count [256];
  ulong local_60;
  UINT gs;
  UINT *cptr;
  UINT MEMSIZE;
  UINT d;
  UINT stage;
  UINT j;
  UINT i;
  UINT kbsd1;
  UINT kbsd;
  UINT n_local;
  LPPSTR a_local;
  
  ta_00 = (LPPSTR)malloc(n * 8);
  __ptr = (LPBYTE)malloc(n << 2);
  _sp->sa = a;
  _sp->sk = __ptr;
  _sp->sn = (int)n;
  piVar1 = &_sp->sb;
  _sp = _sp + 1;
  *piVar1 = 0;
  for (j = 0; j < 0xff; j = j + 1) {
    count[j - 1] = 0;
  }
LAB_00317274:
  do {
    while( true ) {
      if (_sp < (Stack *)((long)&stack[0].sa + 1)) {
        free(ta_00);
        free(__ptr);
        return;
      }
      pSVar6 = _sp + -1;
      a_00 = _sp[-1].sa;
      kb_00 = (LPPSTR)_sp[-1].sk;
      n_00 = (ulong)_sp[-1].sn;
      iVar2 = _sp[-1].sb;
      d_00 = (ulong)iVar2;
      _sp = pSVar6;
      if (kb_00 != (LPPSTR)0x0) break;
      RDFK(&ak,a_00,n_00,ta_00,(UINT *)&tj,d_00);
    }
    uVar3 = d_00 & 3;
    if (uVar3 == 0) {
      if (n_00 < 0x81) {
        RDFK(&ak,a_00,n_00,ta_00,(UINT *)&tj,d_00);
        goto LAB_00317274;
      }
      FillKeyBuffer(a_00,(LPBYTE)kb_00,(UINT *)&tj,n_00,d_00);
    }
    else {
      kb = (LPSTR)kb_00;
      for (j = 0; j < n_00; j = j + 1) {
        count[(ulong)*kb - 1] = count[(ulong)*kb - 1] + 1;
        kb = kb + (4 - uVar3);
      }
    }
    for (gs = (UINT)&tj; *(long *)gs == 0; gs = gs + 8) {
    }
    local_60 = n_00;
    if (n_00 <= *(ulong *)gs) {
      local_60 = 0;
    }
    lVar4 = -uVar3 + 4;
    uVar3 = -uVar3 + 3;
    ak = a_00;
    GrpKP[0xff] = kb_00;
    ta = a_00;
    tl = (LPSTR)kb_00;
    for (j = 0; j < 0xff; j = j + 1) {
      ta = ta + count[j - 1];
      GrpKP[j] = ta;
      tl = tl + count[j - 1] * uVar3;
      GrpKB[j] = tl;
    }
    memcpy(ta_00,a_00,local_60 << 3);
    t = ta_00;
    tl = (LPSTR)kb_00;
    for (j = 0; j < local_60; j = j + 1) {
      *GrpKP[(ulong)*tl - 1] = *t;
      GrpKP[(ulong)*tl - 1] = GrpKP[(ulong)*tl - 1] + 1;
      tl = tl + lVar4;
      t = t + 1;
    }
    memcpy(ta_00,kb_00,n_00 * lVar4);
    j = 0;
    ss = (LPSTR)ta_00;
    while (j < n_00) {
      pppuVar5 = GrpKP + (ulong)*ss + 0xff;
      tt = (LPSTR)*pppuVar5;
      local_8a0 = ss;
      for (stage = 0; local_8a0 = local_8a0 + 1, stage < uVar3; stage = stage + 1) {
        *tt = *local_8a0;
        tt = tt + 1;
      }
      ss = ss + lVar4;
      j = j + 1;
      *pppuVar5 = (LPPSTR)(uVar3 + (long)*pppuVar5);
    }
    ta = a_00;
    tl = (LPSTR)kb_00;
    for (j = 0; j < 0xff; j = j + 1) {
      if ((j == 0) || (count[j - 1] < 0x15)) {
        if ((1 < count[j - 1]) && (j != 0)) {
          insertion_sort(ta,(int)count[j - 1],d_00);
        }
      }
      else {
        _sp->sa = ta;
        _sp->sk = tl;
        _sp->sn = (int)count[j - 1];
        piVar1 = &_sp->sb;
        _sp = _sp + 1;
        *piVar1 = iVar2 + 1;
      }
      ta = ta + count[j - 1];
      tl = tl + count[j - 1] * uVar3;
      count[j - 1] = 0;
    }
  } while( true );
}

Assistant:

void cradix_rantala(LPPSTR a, UINT n)
{
	UINT kbsd, kbsd1, i, j, stage, d, MEMSIZE;
	UINT *cptr, gs, count[AS];
	LPSTR tj, tk, ax, tl, kb, ss, tt, GrpKB[AS];
	LPPSTR GrpKP[AS], ak, ta, tc, t;
	if (sizeof(LPPSTR)>sizeof(unsigned char)*BS)
		MEMSIZE=sizeof(LPPSTR);
	else
		MEMSIZE=sizeof(unsigned char)*BS;
	/* workspace */
	ta = (LPPSTR)malloc(n * MEMSIZE);
	/* memory for key buffers */
	tk = (LPBYTE)malloc(n * sizeof(unsigned char) * BS);
	tj=tk;
	push(a, tk, n, 0); for (i=AL; i<AH; i++) count[i]=0;
	while (!stackempty()) {
		pop(a, tk, n, stage);
		if (tk) {
			/* set the counters and
			   fill the key buffers if necessary */
			if ((d=stage%BS)!=0)
				for (i=0, tl=tk; i<n; i++, tl+=(BS-d))
					count[*tl]++;
			else {
				if (n>KBC)
					FillKeyBuffer(a, tk, count, n, stage);
				else {
					RDFK(GrpKP, a, n, ta, count, stage);
					continue;
				}
			}
			/* check if there is only 1 group */
			cptr=&count[AL];
			while (*cptr<1) cptr++;
			if (*cptr<n) gs=n; else gs=0;
			/* calculate both key ptr and
			   key buffer addresses */
			kbsd=BS-d, kbsd1=kbsd-1;
			GrpKP[AL]=a; GrpKB[AL]=tk;
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				GrpKP[i+1]=ak+=count[i];
				GrpKB[i+1]=ax+=count[i]*kbsd1;
			}

			/* permute the key ptrs */
			memcpy(ta, a, sizeof(LPSTR)*gs);
			for (i=0, ax=tk, tc=ta; i<gs;
					i++, ax+=kbsd, tc++) {
				*GrpKP[*ax]=*tc; GrpKP[*ax]++;
			}
			/* permute the key buffers */
			memcpy(ta, tk, sizeof(unsigned char)*n*kbsd);
			for (i=0, kb=(LPBYTE)ta; i<n; i++, *t+=kbsd1) {
				t=&GrpKB[*kb]; ss=*t; tt=kb+1;
				for (j=0; j<kbsd1; j++)
				{ *ss=*tt; ss++; tt++; }
				kb+=kbsd;
			}
			/* down 1 level */
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				if (splittable(i))
				{ push(ak, ax, count[i], stage+1); }
				else if (count[i]>1 && i>0)
					insertion_sort(ak, count[i], stage);
				ak+=count[i]; ax+=count[i]*(kbsd1);
				count[i]=0;
			}
		}
		else RDFK(GrpKP, a, n, ta, count, stage);
	}
	free((void*)ta);
	free((void*)tj);
}